

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O3

size_t apduCmdEnc(octet *apdu,apdu_cmd_t *cmd)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  octet *poVar4;
  
  if (apdu == (octet *)0x0) {
    poVar4 = (octet *)0x0;
  }
  else {
    *apdu = cmd->cla;
    apdu[1] = cmd->ins;
    apdu[2] = cmd->p1;
    apdu[3] = cmd->p2;
    poVar4 = apdu + 4;
  }
  uVar3 = cmd->cdf_len;
  if (uVar3 == 0) {
    sVar2 = 4;
    uVar3 = 0;
  }
  else if ((uVar3 < 0x100) && (cmd->rdf_len < 0x101)) {
    if (poVar4 == (octet *)0x0) {
      poVar4 = (octet *)0x0;
    }
    else {
      *poVar4 = (octet)uVar3;
      memCopy(poVar4 + 1,cmd + 1,cmd->cdf_len);
      uVar3 = cmd->cdf_len;
      poVar4 = poVar4 + uVar3 + 1;
    }
    sVar2 = uVar3 + 5;
  }
  else {
    if (poVar4 == (octet *)0x0) {
      poVar4 = (octet *)0x0;
    }
    else {
      *poVar4 = '\0';
      poVar4[1] = *(octet *)((long)&cmd->cdf_len + 1);
      poVar4[2] = (octet)cmd->cdf_len;
      memCopy(poVar4 + 3,cmd + 1,cmd->cdf_len);
      uVar3 = cmd->cdf_len;
      poVar4 = poVar4 + uVar3 + 3;
    }
    sVar2 = uVar3 + 7;
  }
  uVar1 = cmd->rdf_len;
  if (uVar1 != 0) {
    if (uVar1 < 0x101) {
      if (uVar3 < 0x100) {
        if (poVar4 != (octet *)0x0) {
          *poVar4 = (octet)uVar1;
        }
        return sVar2 + 1;
      }
    }
    else if (uVar3 == 0) {
      if (poVar4 != (octet *)0x0) {
        *poVar4 = '\0';
        poVar4[1] = *(octet *)((long)&cmd->rdf_len + 1);
        poVar4[2] = (octet)cmd->rdf_len;
      }
      return sVar2 + 3;
    }
    if (poVar4 != (octet *)0x0) {
      *poVar4 = (octet)(uVar1 >> 8);
      poVar4[1] = (octet)cmd->rdf_len;
    }
    sVar2 = sVar2 + 2;
  }
  return sVar2;
}

Assistant:

size_t apduCmdEnc(octet apdu[], const apdu_cmd_t* cmd)
{
	size_t count;
	// pre
	ASSERT(apduCmdIsValid(cmd));
	// кодировать заголовок
	if (apdu)
	{
		ASSERT(memIsDisjoint2(apdu, 4, cmd, apduCmdSizeof(cmd)));
		apdu[0] = cmd->cla, apdu[1] = cmd->ins;
		apdu[2] = cmd->p1, apdu[3] = cmd->p2;
		apdu += 4;
	}
	count = 4;
	// кодировать [cdf_len]cdf: пустая форма
	if (cmd->cdf_len == 0)
		count += 0 + cmd->cdf_len;
	// кодировать [cdf_len]cdf: короткая форма
	else if (cmd->cdf_len < 256 && cmd->rdf_len <= 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->cdf_len;
			memCopy(apdu + 1, cmd->cdf, cmd->cdf_len);
			apdu += 1 + cmd->cdf_len;
		}
		count += 1 + cmd->cdf_len;
	}
	// кодировать [cdf_len]cdf: длинная форма
	else
	{
		ASSERT(cmd->cdf_len < 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->cdf_len / 256);
			apdu[2] = (octet)cmd->cdf_len;
			memCopy(apdu + 3, cmd->cdf, cmd->cdf_len);
			apdu += 3 + cmd->cdf_len;
		}
		count += 3 + cmd->cdf_len;
	}
	// кодировать rdf_len: пустая форма
	if (cmd->rdf_len == 0)
		count += 0;
	// кодировать rdf_len: короткая форма
	else if (cmd->rdf_len <= 256 && cmd->cdf_len < 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->rdf_len;
		}
		count += 1;
	}
	// кодировать rdf_len: длинная форма, 2 октета
	else if (cmd->cdf_len)
	{ 
		ASSERT(256 <= cmd->cdf_len || 256 < cmd->rdf_len);
		ASSERT(cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 2, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)(cmd->rdf_len / 256);
			apdu[1] = (octet)cmd->rdf_len;
		}
		count += 2;
	}
	else
	{
		ASSERT(256 < cmd->rdf_len && cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->rdf_len / 256);
			apdu[2] = (octet)cmd->rdf_len;
		}
		count += 3;
	}
	// возвратить длину кода
	return count;
}